

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::Compiler::get_work_group_size_specialization_constants
          (Compiler *this,SpecializationConstant *x,SpecializationConstant *y,
          SpecializationConstant *z)

{
  SpecializationConstant SVar1;
  SpecializationConstant SVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ID local_a8;
  TypedID<(spirv_cross::Types)3> local_a4;
  SPIRConstant *local_a0;
  SPIRConstant *cz;
  SPIRConstant *local_90;
  SPIRConstant *cy;
  SPIRConstant *local_80;
  SPIRConstant *cx;
  uint32_t local_70;
  TypedID<(spirv_cross::Types)0> local_6c;
  uint32_t local_68;
  uint32_t local_64;
  TypedID<(spirv_cross::Types)0> local_60;
  uint32_t local_5c;
  uint32_t local_58;
  TypedID<(spirv_cross::Types)0> local_54;
  SPIRConstant *local_50;
  SPIRConstant *c;
  TypedID<(spirv_cross::Types)3> local_40;
  undefined4 uStack_3c;
  TypedID<(spirv_cross::Types)3> local_38;
  undefined4 uStack_34;
  SPIREntryPoint *local_30;
  SPIREntryPoint *execution;
  SpecializationConstant *z_local;
  SpecializationConstant *y_local;
  SpecializationConstant *x_local;
  Compiler *this_local;
  
  execution = (SPIREntryPoint *)z;
  z_local = y;
  y_local = x;
  x_local = (SpecializationConstant *)this;
  local_30 = get_entry_point(this);
  TypedID<(spirv_cross::Types)3>::TypedID(&local_38,0);
  uStack_34 = 0;
  SVar2.constant_id = 0;
  SVar2.id.id = local_38.id;
  *y_local = SVar2;
  TypedID<(spirv_cross::Types)3>::TypedID(&local_40,0);
  uStack_3c = 0;
  SVar1.constant_id = 0;
  SVar1.id.id = local_40.id;
  *z_local = SVar1;
  TypedID<(spirv_cross::Types)3>::TypedID((TypedID<(spirv_cross::Types)3> *)&c,0);
  c._4_4_ = 0;
  *(ulong *)execution = (ulong)(uint)c;
  if ((local_30->workgroup_size).constant == 0) {
    bVar3 = Bitset::get(&local_30->flags,0x26);
    if (bVar3) {
      local_80 = get<spirv_cross::SPIRConstant>(this,(local_30->workgroup_size).id_x);
      if ((local_80->specialization & 1U) != 0) {
        TypedID<(spirv_cross::Types)3>::TypedID
                  ((TypedID<(spirv_cross::Types)3> *)((long)&cy + 4),(local_30->workgroup_size).id_x
                  );
        (y_local->id).id = cy._4_4_;
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)&cy,(local_30->workgroup_size).id_x);
        uVar4 = get_decoration(this,cy._0_4_,DecorationSpecId);
        y_local->constant_id = uVar4;
      }
      local_90 = get<spirv_cross::SPIRConstant>(this,(local_30->workgroup_size).id_y);
      if ((local_90->specialization & 1U) != 0) {
        TypedID<(spirv_cross::Types)3>::TypedID
                  ((TypedID<(spirv_cross::Types)3> *)((long)&cz + 4),(local_30->workgroup_size).id_y
                  );
        (z_local->id).id = cz._4_4_;
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)&cz,(local_30->workgroup_size).id_y);
        uVar4 = get_decoration(this,cz._0_4_,DecorationSpecId);
        z_local->constant_id = uVar4;
      }
      local_a0 = get<spirv_cross::SPIRConstant>(this,(local_30->workgroup_size).id_z);
      if ((local_a0->specialization & 1U) != 0) {
        TypedID<(spirv_cross::Types)3>::TypedID(&local_a4,(local_30->workgroup_size).id_z);
        (execution->self).id = local_a4.id;
        TypedID<(spirv_cross::Types)0>::TypedID(&local_a8,(local_30->workgroup_size).id_z);
        uVar4 = get_decoration(this,local_a8,DecorationSpecId);
        *(uint32_t *)&execution->field_0x4 = uVar4;
      }
    }
  }
  else {
    local_50 = get<spirv_cross::SPIRConstant>(this,(local_30->workgroup_size).constant);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)(local_50->m).c[0].id);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_54,0);
    uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_54);
    if (uVar4 != uVar5) {
      local_58 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)(local_50->m).c[0].id);
      (y_local->id).id = local_58;
      local_5c = (local_50->m).c[0].id[0].id;
      uVar4 = get_decoration(this,(ID)local_5c,DecorationSpecId);
      y_local->constant_id = uVar4;
    }
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((local_50->m).c[0].id + 1));
    TypedID<(spirv_cross::Types)0>::TypedID(&local_60,0);
    uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_60);
    if (uVar4 != uVar5) {
      local_64 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)((local_50->m).c[0].id + 1))
      ;
      (z_local->id).id = local_64;
      local_68 = (local_50->m).c[0].id[1].id;
      uVar4 = get_decoration(this,(ID)local_68,DecorationSpecId);
      z_local->constant_id = uVar4;
    }
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((local_50->m).c[0].id + 2));
    TypedID<(spirv_cross::Types)0>::TypedID(&local_6c,0);
    uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_6c);
    if (uVar4 != uVar5) {
      local_70 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)((local_50->m).c[0].id + 2))
      ;
      (execution->self).id = local_70;
      cx._4_4_ = (local_50->m).c[0].id[2].id;
      uVar4 = get_decoration(this,cx._4_4_,DecorationSpecId);
      *(uint32_t *)&execution->field_0x4 = uVar4;
    }
  }
  return (local_30->workgroup_size).constant;
}

Assistant:

uint32_t Compiler::get_work_group_size_specialization_constants(SpecializationConstant &x, SpecializationConstant &y,
                                                                SpecializationConstant &z) const
{
	auto &execution = get_entry_point();
	x = { 0, 0 };
	y = { 0, 0 };
	z = { 0, 0 };

	// WorkgroupSize builtin takes precedence over LocalSize / LocalSizeId.
	if (execution.workgroup_size.constant != 0)
	{
		auto &c = get<SPIRConstant>(execution.workgroup_size.constant);

		if (c.m.c[0].id[0] != ID(0))
		{
			x.id = c.m.c[0].id[0];
			x.constant_id = get_decoration(c.m.c[0].id[0], DecorationSpecId);
		}

		if (c.m.c[0].id[1] != ID(0))
		{
			y.id = c.m.c[0].id[1];
			y.constant_id = get_decoration(c.m.c[0].id[1], DecorationSpecId);
		}

		if (c.m.c[0].id[2] != ID(0))
		{
			z.id = c.m.c[0].id[2];
			z.constant_id = get_decoration(c.m.c[0].id[2], DecorationSpecId);
		}
	}
	else if (execution.flags.get(ExecutionModeLocalSizeId))
	{
		auto &cx = get<SPIRConstant>(execution.workgroup_size.id_x);
		if (cx.specialization)
		{
			x.id = execution.workgroup_size.id_x;
			x.constant_id = get_decoration(execution.workgroup_size.id_x, DecorationSpecId);
		}

		auto &cy = get<SPIRConstant>(execution.workgroup_size.id_y);
		if (cy.specialization)
		{
			y.id = execution.workgroup_size.id_y;
			y.constant_id = get_decoration(execution.workgroup_size.id_y, DecorationSpecId);
		}

		auto &cz = get<SPIRConstant>(execution.workgroup_size.id_z);
		if (cz.specialization)
		{
			z.id = execution.workgroup_size.id_z;
			z.constant_id = get_decoration(execution.workgroup_size.id_z, DecorationSpecId);
		}
	}

	return execution.workgroup_size.constant;
}